

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O2

link_type __thiscall
nestl::impl::detail::
rb_tree<void*,void*,nestl::impl::detail::identity<void*>,std::less<void*>,nestl::allocator<void*>>::
m_create_node<nestl::has_exceptions::exception_ptr_error,void*>
          (rb_tree<void*,void*,nestl::impl::detail::identity<void*>,std::less<void*>,nestl::allocator<void*>>
           *this,exception_ptr_error *err,void **args)

{
  pointer prVar1;
  bool bVar2;
  pointer prVar3;
  pointer prVar4;
  
  prVar4 = (pointer)0x0;
  prVar3 = allocator<nestl::impl::detail::rb_tree_node<void_*>_>::
           allocate<nestl::has_exceptions::exception_ptr_error>
                     ((allocator<nestl::impl::detail::rb_tree_node<void_*>_> *)this,err,1,
                      (void *)0x0);
  bVar2 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
  if (!bVar2) {
    (prVar3->m_storage).m_storage = (storage_type)*args;
    bVar2 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
    prVar4 = prVar3;
    prVar1 = (pointer)0x0;
    if (bVar2) {
      prVar4 = (pointer)0x0;
      prVar1 = prVar3;
    }
    operator_delete(prVar1);
  }
  return prVar4;
}

Assistant:

link_type m_create_node(OperationError& err, Args&&... args) NESTL_NOEXCEPT_SPEC
    {
        node_allocator& node_alloc = m_get_node_allocator();
        link_type l = node_allocator_traits::allocate(err, node_alloc, 1);
        if (err)
        {
            return nullptr;
        }

        nestl::detail::deallocation_scoped_guard<link_type, node_allocator> guard(node_alloc, l, 1);

        l->construct_val(err, std::forward<Args>(args)...);
        if (err)
        {
            return nullptr;
        }

        guard.release();
        return l;
    }